

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

VariableP<float> __thiscall
deqp::gls::BuiltinPrecisionTests::bindExpression<float>
          (BuiltinPrecisionTests *this,string *name,ExpandContext *ctx,ExprP<float> *expr)

{
  ExprP<float> *this_00;
  SharedPtrStateBase *extraout_RDX;
  VariableP<float> VVar1;
  StatementP local_40;
  undefined1 local_29;
  ExprP<float> *local_28;
  ExprP<float> *expr_local;
  ExpandContext *ctx_local;
  string *name_local;
  VariableP<float> *var;
  
  local_29 = 0;
  local_28 = expr;
  expr_local = (ExprP<float> *)ctx;
  ctx_local = (ExpandContext *)name;
  name_local = (string *)this;
  ExpandContext::genSym<float>((ExpandContext *)this,(string *)ctx);
  this_00 = expr_local;
  variableDeclaration<float>((BuiltinPrecisionTests *)&local_40,(VariableP<float> *)this,local_28);
  ExpandContext::addStatement((ExpandContext *)this_00,&local_40);
  StatementP::~StatementP(&local_40);
  VVar1.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_state =
       extraout_RDX;
  VVar1.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr =
       (Variable<float> *)this;
  return (VariableP<float>)
         VVar1.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>;
}

Assistant:

VariableP<T> bindExpression (const string& name, ExpandContext& ctx, const ExprP<T>& expr)
{
	VariableP<T> var = ctx.genSym<T>(name);
	ctx.addStatement(variableDeclaration(var, expr));
	return var;
}